

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

bool __thiscall Rml::DataViewVisible::Update(DataViewVisible *this,DataModel *model)

{
  Node *pNVar1;
  code *pcVar2;
  undefined1 uVar3;
  bool bVar4;
  Element *element;
  PropertyMap *this_00;
  size_t sVar5;
  undefined1 uVar6;
  DataExpression *this_01;
  Variant variant;
  DataExpressionInterface expr_interface;
  Variant VStack_b8;
  Property local_90;
  DataExpressionInterface local_40;
  
  Variant::Variant(&VStack_b8);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_40,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_01 = (this->super_DataViewCommon).expression._M_t.
              super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
              .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    if (this_01 == (DataExpression *)0x0) {
      bVar4 = Assert("RMLUI_ASSERT(expression)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x4f);
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      this_01 = (this->super_DataViewCommon).expression._M_t.
                super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    }
    bVar4 = DataExpression::Run(this_01,&local_40,&VStack_b8);
    if (bVar4) {
      local_90.value.type = local_90.value.type & 0xffffffffffffff00;
      Variant::GetInto<bool,_0>(&VStack_b8,(bool *)&local_90);
      uVar3 = (undefined1)local_90.value.type;
      this_00 = Element::GetLocalStyleProperties(element);
      local_90.value.type = CONCAT71(local_90.value.type._1_7_,0x2a);
      pNVar1 = this_00->mKeyVals;
      sVar5 = robin_hood::detail::
              Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
              ::findIdx<Rml::PropertyId>(this_00,(PropertyId *)&local_90);
      uVar6 = pNVar1 + sVar5 != (Node *)this_00->mInfo ^ uVar3;
      if (uVar6 == 0) {
        if (uVar3 == 0) {
          local_90.value.type = NONE;
          Variant::Set(&local_90.value,1);
          local_90.unit = KEYWORD;
          local_90.specificity = -1;
          local_90.definition = (PropertyDefinition *)0x0;
          local_90.parser_index = -1;
          local_90.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          local_90.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          Element::SetProperty(element,Visibility,&local_90);
          if (local_90.source.
              super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.source.
                       super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          Variant::~Variant(&local_90.value);
        }
        else {
          Element::RemoveProperty(element,Visibility);
        }
      }
      uVar6 = uVar6 ^ 1;
      goto LAB_00203a05;
    }
  }
  uVar6 = 0;
LAB_00203a05:
  Variant::~Variant(&VStack_b8);
  return (bool)uVar6;
}

Assistant:

bool DataViewVisible::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const bool value = variant.Get<bool>();
		const bool is_visible = (element->GetLocalStyleProperties().count(PropertyId::Visibility) == 0);
		if (is_visible != value)
		{
			if (value)
				element->RemoveProperty(PropertyId::Visibility);
			else
				element->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));
			result = true;
		}
	}
	return result;
}